

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.h
# Opt level: O0

cmCommand * __thiscall cmStringCommand::Clone(cmStringCommand *this)

{
  cmCommand *this_00;
  cmStringCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmStringCommand((cmStringCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmStringCommand; }